

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

void __thiscall
WScriptJsrt::ModuleMessage::ModuleMessage
          (ModuleMessage *this,JsModuleRecord module,JsValueRef specifier,string *fullPathPtr)

{
  pointer pcVar1;
  uint uVar2;
  string *psVar3;
  
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__MessageBase_00188468;
  (this->super_MessageBase).m_time = 0;
  uVar2 = MessageBase::s_messageCount + 1;
  (this->super_MessageBase).m_id = MessageBase::s_messageCount;
  MessageBase::s_messageCount = uVar2;
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__ModuleMessage_00188380;
  this->moduleRecord = module;
  this->specifier = specifier;
  this->fullPath = (string *)0x0;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)(module,(uint *)0x0);
  if (specifier != (JsValueRef)0x0) {
    psVar3 = (string *)operator_new(0x20);
    (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
    pcVar1 = (fullPathPtr->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar3,pcVar1,pcVar1 + fullPathPtr->_M_string_length);
    this->fullPath = psVar3;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)(specifier,(uint *)0x0);
    return;
  }
  return;
}

Assistant:

WScriptJsrt::ModuleMessage::ModuleMessage(JsModuleRecord module, JsValueRef specifier, std::string* fullPathPtr)
    : MessageBase(0), moduleRecord(module), specifier(specifier)
{
    fullPath = nullptr;
    ChakraRTInterface::JsAddRef(module, nullptr);
    if (specifier != nullptr)
    {
        fullPath = new std::string (*fullPathPtr);
        // nullptr specifier means a Promise to execute; non-nullptr means a "fetch" operation.
        ChakraRTInterface::JsAddRef(specifier, nullptr);
    }
}